

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O0

void xercesc_4_0::XMLUri::normalizeURI(XMLCh *systemURI,XMLBuffer *normalizedURI)

{
  XMLCh *local_20;
  XMLCh *pszSrc;
  XMLBuffer *normalizedURI_local;
  XMLCh *systemURI_local;
  
  XMLBuffer::reset(normalizedURI);
  local_20 = systemURI;
  while (*local_20 != L'\0') {
    if (((*local_20 == L'%') && (local_20[1] == L'2')) && (local_20[2] == L'0')) {
      local_20 = local_20 + 3;
      XMLBuffer::append(normalizedURI,L' ');
    }
    else {
      XMLBuffer::append(normalizedURI,*local_20);
      local_20 = local_20 + 1;
    }
  }
  return;
}

Assistant:

void XMLUri::normalizeURI(const XMLCh*     const systemURI,
                                XMLBuffer&       normalizedURI)
{
    const XMLCh* pszSrc = systemURI;

    normalizedURI.reset();

    while (*pszSrc) {

        if ((*(pszSrc) == chPercent)
        &&  (*(pszSrc+1) == chDigit_2)
        &&  (*(pszSrc+2) == chDigit_0))
        {
            pszSrc += 3;
            normalizedURI.append(chSpace);
        }
        else
        {
            normalizedURI.append(*pszSrc);
            pszSrc++;
        }
    }
}